

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::OneofOptions::MergePartialFromCodedStream
          (OneofOptions *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  void *pvVar5;
  bool bVar6;
  uint32 uVar7;
  Type *this_01;
  pair<int,_int> pVar8;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  int byte_limit;
  UnknownFieldSet *pUVar12;
  
  this_00 = &this->_internal_metadata_;
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar7 = (uint32)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar10 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar10) < 0x80)) goto LAB_003d116c;
        uVar10 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = (ulong)uVar10 | 0x100000000;
    }
    else {
LAB_003d116c:
      uVar7 = io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar11 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar7 | uVar11;
    }
    uVar10 = (uint)uVar11;
    if (((uVar11 & 0x100000000) == 0) || ((char)uVar11 != ':' || (uVar10 & 0xfffffff8) != 0x1f38)) {
      cVar9 = '\a';
      if ((uVar10 & 7) != 4 && uVar10 != 0) {
        if (uVar10 < 8000) {
          pvVar5 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar5 & 1) == 0) {
            pUVar12 = internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            pUVar12 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
          }
          bVar6 = internal::WireFormat::SkipField(input,uVar10,pUVar12);
LAB_003d1106:
          cVar9 = '\x06';
          if (bVar6 != false) {
            cVar9 = '\0';
          }
        }
        else {
          pvVar5 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar5 & 1) == 0) {
            pUVar12 = internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            pUVar12 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
          }
          bVar6 = internal::ExtensionSet::ParseField
                            (&this->_extensions_,uVar10,input,
                             (Message *)&_OneofOptions_default_instance_,pUVar12);
          cVar9 = !bVar6 * '\x03' + '\x03';
        }
      }
    }
    else {
      this_01 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
        bVar6 = true;
      }
      else {
        byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar6 = -1 < byte_limit;
      }
      cVar9 = '\x06';
      if (bVar6) {
        pVar8 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
        cVar9 = '\x06';
        if (-1 < (long)pVar8) {
          bVar6 = UninterpretedOption::MergePartialFromCodedStream(this_01,input);
          cVar9 = '\x06';
          if (bVar6) {
            bVar6 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar8.first);
            goto LAB_003d1106;
          }
        }
      }
    }
    if ((cVar9 != '\0') && (cVar9 != '\x03')) {
      return cVar9 != '\x06';
    }
  } while( true );
}

Assistant:

bool OneofOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.OneofOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.OneofOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.OneofOptions)
  return false;
#undef DO_
}